

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O0

string * cmStrCat<std::__cxx11::string,char,char_const(&)[69],std::__cxx11::string&,char_const(&)[20],std::__cxx11::string,char_const(&)[171],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[41],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[6]>
                   (string *__return_storage_ptr__,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *a,char *b,
                   char (*args) [69],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
                   char (*args_2) [20],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3,
                   char (*args_4) [171],basic_string_view<char,_std::char_traits<char>_> *args_5,
                   char (*args_6) [41],basic_string_view<char,_std::char_traits<char>_> *args_7,
                   char (*args_8) [6])

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string_view view;
  string_view view_00;
  cmAlphaNum local_3d8;
  size_t local_3a0;
  char *local_398;
  cmAlphaNum local_390;
  cmAlphaNum local_358;
  size_t local_320;
  char *local_318;
  cmAlphaNum local_310;
  cmAlphaNum local_2d8;
  cmAlphaNum local_2a0;
  cmAlphaNum local_268;
  cmAlphaNum local_230;
  cmAlphaNum local_1f8;
  cmAlphaNum local_1c0;
  cmAlphaNum local_188;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_150;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_138;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_120;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_108;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_f0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_d8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_c0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_a8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_90;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_78;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_60;
  iterator local_48;
  undefined8 local_40;
  char (*local_38) [20];
  char (*args_local_2) [20];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_1;
  char (*args_local) [69];
  char *b_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *a_local;
  
  local_38 = args_2;
  args_local_2 = (char (*) [20])args_1;
  args_local_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args;
  args_local = (char (*) [69])b;
  b_local = (char *)a;
  a_local = __return_storage_ptr__;
  cmAlphaNum::cmAlphaNum(&local_188,a);
  cmStrCat<std::__cxx11::string,char,char_const(&)[69],std::__cxx11::string&,char_const(&)[20],std::__cxx11::string,char_const(&)[171],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[41],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[6]>(std::__cxx11::string&&,char&&,char_const(&)[69],std::__cxx11::string&,char_const(&)[20],std::__cxx11::string&&,char_const(&)[171],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[41],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[6])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&local_150,
             &cmStrCat<std::__cxx11::string,char,char_const(&)[69],std::__cxx11::string&,char_const(&)[20],std::__cxx11::string,char_const(&)[171],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[41],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[6]>(std::__cxx11::string&&,char&&,char_const&[],std::__cxx11::string&,char_const&[],std::__cxx11::string&&,char_const&[],std::basic_string_view<char,std::char_traits<char>>&,char_const&[],std::basic_string_view<char,std::char_traits<char>>&,char_const&[])
              ::makePair,&local_188);
  cmAlphaNum::cmAlphaNum(&local_1c0,(*args_local)[0]);
  cmStrCat<std::__cxx11::string,char,char_const(&)[69],std::__cxx11::string&,char_const(&)[20],std::__cxx11::string,char_const(&)[171],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[41],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[6]>(std::__cxx11::string&&,char&&,char_const(&)[69],std::__cxx11::string&,char_const(&)[20],std::__cxx11::string&&,char_const(&)[171],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[41],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[6])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_138,
             &cmStrCat<std::__cxx11::string,char,char_const(&)[69],std::__cxx11::string&,char_const(&)[20],std::__cxx11::string,char_const(&)[171],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[41],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[6]>(std::__cxx11::string&&,char&&,char_const&[],std::__cxx11::string&,char_const&[],std::__cxx11::string&&,char_const&[],std::basic_string_view<char,std::char_traits<char>>&,char_const&[],std::basic_string_view<char,std::char_traits<char>>&,char_const&[])
              ::makePair,&local_1c0);
  cmAlphaNum::cmAlphaNum(&local_1f8,(char *)args_local_1);
  cmStrCat<std::__cxx11::string,char,char_const(&)[69],std::__cxx11::string&,char_const(&)[20],std::__cxx11::string,char_const(&)[171],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[41],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[6]>(std::__cxx11::string&&,char&&,char_const(&)[69],std::__cxx11::string&,char_const(&)[20],std::__cxx11::string&&,char_const(&)[171],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[41],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[6])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_120,
             &cmStrCat<std::__cxx11::string,char,char_const(&)[69],std::__cxx11::string&,char_const(&)[20],std::__cxx11::string,char_const(&)[171],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[41],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[6]>(std::__cxx11::string&&,char&&,char_const&[],std::__cxx11::string&,char_const&[],std::__cxx11::string&&,char_const&[],std::basic_string_view<char,std::char_traits<char>>&,char_const&[],std::basic_string_view<char,std::char_traits<char>>&,char_const&[])
              ::makePair,&local_1f8);
  cmAlphaNum::cmAlphaNum(&local_230,(string *)args_local_2);
  cmStrCat<std::__cxx11::string,char,char_const(&)[69],std::__cxx11::string&,char_const(&)[20],std::__cxx11::string,char_const(&)[171],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[41],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[6]>(std::__cxx11::string&&,char&&,char_const(&)[69],std::__cxx11::string&,char_const(&)[20],std::__cxx11::string&&,char_const(&)[171],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[41],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[6])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_108,
             &cmStrCat<std::__cxx11::string,char,char_const(&)[69],std::__cxx11::string&,char_const(&)[20],std::__cxx11::string,char_const(&)[171],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[41],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[6]>(std::__cxx11::string&&,char&&,char_const&[],std::__cxx11::string&,char_const&[],std::__cxx11::string&&,char_const&[],std::basic_string_view<char,std::char_traits<char>>&,char_const&[],std::basic_string_view<char,std::char_traits<char>>&,char_const&[])
              ::makePair,&local_230);
  cmAlphaNum::cmAlphaNum(&local_268,*local_38);
  cmStrCat<std::__cxx11::string,char,char_const(&)[69],std::__cxx11::string&,char_const(&)[20],std::__cxx11::string,char_const(&)[171],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[41],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[6]>(std::__cxx11::string&&,char&&,char_const(&)[69],std::__cxx11::string&,char_const(&)[20],std::__cxx11::string&&,char_const(&)[171],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[41],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[6])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_f0,
             &cmStrCat<std::__cxx11::string,char,char_const(&)[69],std::__cxx11::string&,char_const(&)[20],std::__cxx11::string,char_const(&)[171],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[41],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[6]>(std::__cxx11::string&&,char&&,char_const&[],std::__cxx11::string&,char_const&[],std::__cxx11::string&&,char_const&[],std::basic_string_view<char,std::char_traits<char>>&,char_const&[],std::basic_string_view<char,std::char_traits<char>>&,char_const&[])
              ::makePair,&local_268);
  cmAlphaNum::cmAlphaNum(&local_2a0,args_3);
  cmStrCat<std::__cxx11::string,char,char_const(&)[69],std::__cxx11::string&,char_const(&)[20],std::__cxx11::string,char_const(&)[171],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[41],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[6]>(std::__cxx11::string&&,char&&,char_const(&)[69],std::__cxx11::string&,char_const(&)[20],std::__cxx11::string&&,char_const(&)[171],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[41],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[6])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_d8,
             &cmStrCat<std::__cxx11::string,char,char_const(&)[69],std::__cxx11::string&,char_const(&)[20],std::__cxx11::string,char_const(&)[171],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[41],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[6]>(std::__cxx11::string&&,char&&,char_const&[],std::__cxx11::string&,char_const&[],std::__cxx11::string&&,char_const&[],std::basic_string_view<char,std::char_traits<char>>&,char_const&[],std::basic_string_view<char,std::char_traits<char>>&,char_const&[])
              ::makePair,&local_2a0);
  cmAlphaNum::cmAlphaNum(&local_2d8,*args_4);
  cmStrCat<std::__cxx11::string,char,char_const(&)[69],std::__cxx11::string&,char_const(&)[20],std::__cxx11::string,char_const(&)[171],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[41],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[6]>(std::__cxx11::string&&,char&&,char_const(&)[69],std::__cxx11::string&,char_const(&)[20],std::__cxx11::string&&,char_const(&)[171],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[41],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[6])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_c0,
             &cmStrCat<std::__cxx11::string,char,char_const(&)[69],std::__cxx11::string&,char_const(&)[20],std::__cxx11::string,char_const(&)[171],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[41],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[6]>(std::__cxx11::string&&,char&&,char_const&[],std::__cxx11::string&,char_const&[],std::__cxx11::string&&,char_const&[],std::basic_string_view<char,std::char_traits<char>>&,char_const&[],std::basic_string_view<char,std::char_traits<char>>&,char_const&[])
              ::makePair,&local_2d8);
  local_320 = args_5->_M_len;
  local_318 = args_5->_M_str;
  view._M_len = args_5->_M_len;
  view._M_str = args_5->_M_str;
  cmAlphaNum::cmAlphaNum(&local_310,view);
  cmStrCat<std::__cxx11::string,char,char_const(&)[69],std::__cxx11::string&,char_const(&)[20],std::__cxx11::string,char_const(&)[171],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[41],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[6]>(std::__cxx11::string&&,char&&,char_const(&)[69],std::__cxx11::string&,char_const(&)[20],std::__cxx11::string&&,char_const(&)[171],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[41],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[6])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_a8,
             &cmStrCat<std::__cxx11::string,char,char_const(&)[69],std::__cxx11::string&,char_const(&)[20],std::__cxx11::string,char_const(&)[171],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[41],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[6]>(std::__cxx11::string&&,char&&,char_const&[],std::__cxx11::string&,char_const&[],std::__cxx11::string&&,char_const&[],std::basic_string_view<char,std::char_traits<char>>&,char_const&[],std::basic_string_view<char,std::char_traits<char>>&,char_const&[])
              ::makePair,&local_310);
  cmAlphaNum::cmAlphaNum(&local_358,*args_6);
  cmStrCat<std::__cxx11::string,char,char_const(&)[69],std::__cxx11::string&,char_const(&)[20],std::__cxx11::string,char_const(&)[171],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[41],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[6]>(std::__cxx11::string&&,char&&,char_const(&)[69],std::__cxx11::string&,char_const(&)[20],std::__cxx11::string&&,char_const(&)[171],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[41],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[6])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_90,
             &cmStrCat<std::__cxx11::string,char,char_const(&)[69],std::__cxx11::string&,char_const(&)[20],std::__cxx11::string,char_const(&)[171],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[41],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[6]>(std::__cxx11::string&&,char&&,char_const&[],std::__cxx11::string&,char_const&[],std::__cxx11::string&&,char_const&[],std::basic_string_view<char,std::char_traits<char>>&,char_const&[],std::basic_string_view<char,std::char_traits<char>>&,char_const&[])
              ::makePair,&local_358);
  local_3a0 = args_7->_M_len;
  local_398 = args_7->_M_str;
  view_00._M_len = args_7->_M_len;
  view_00._M_str = args_7->_M_str;
  cmAlphaNum::cmAlphaNum(&local_390,view_00);
  cmStrCat<std::__cxx11::string,char,char_const(&)[69],std::__cxx11::string&,char_const(&)[20],std::__cxx11::string,char_const(&)[171],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[41],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[6]>(std::__cxx11::string&&,char&&,char_const(&)[69],std::__cxx11::string&,char_const(&)[20],std::__cxx11::string&&,char_const(&)[171],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[41],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[6])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_78,
             &cmStrCat<std::__cxx11::string,char,char_const(&)[69],std::__cxx11::string&,char_const(&)[20],std::__cxx11::string,char_const(&)[171],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[41],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[6]>(std::__cxx11::string&&,char&&,char_const&[],std::__cxx11::string&,char_const&[],std::__cxx11::string&&,char_const&[],std::basic_string_view<char,std::char_traits<char>>&,char_const&[],std::basic_string_view<char,std::char_traits<char>>&,char_const&[])
              ::makePair,&local_390);
  cmAlphaNum::cmAlphaNum(&local_3d8,*args_8);
  cmStrCat<std::__cxx11::string,char,char_const(&)[69],std::__cxx11::string&,char_const(&)[20],std::__cxx11::string,char_const(&)[171],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[41],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[6]>(std::__cxx11::string&&,char&&,char_const(&)[69],std::__cxx11::string&,char_const(&)[20],std::__cxx11::string&&,char_const(&)[171],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[41],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[6])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_60,
             &cmStrCat<std::__cxx11::string,char,char_const(&)[69],std::__cxx11::string&,char_const(&)[20],std::__cxx11::string,char_const(&)[171],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[41],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[6]>(std::__cxx11::string&&,char&&,char_const&[],std::__cxx11::string&,char_const&[],std::__cxx11::string&&,char_const&[],std::basic_string_view<char,std::char_traits<char>>&,char_const&[],std::basic_string_view<char,std::char_traits<char>>&,char_const&[])
              ::makePair,&local_3d8);
  local_48 = &local_150;
  local_40 = 0xb;
  views._M_len = 0xb;
  views._M_array = local_48;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}